

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int launch_obj(short otyp,int x1,int y1,int x2,int y2,int style)

{
  char cVar1;
  bool bVar2;
  boolean bVar3;
  schar sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int x;
  int y;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  char *local_d0;
  int local_bc;
  monst *local_a0;
  int local_94;
  char *local_88;
  char *bmsg;
  d_level dest;
  trap *ptStack_78;
  int newlev;
  trap *t;
  int ty;
  int tx;
  int delaycnt;
  int tmp;
  int dist;
  boolean otherside;
  boolean used_up;
  obj *ostack;
  obj *singleobj;
  int dy;
  int dx;
  obj *otmp2;
  obj *otmp;
  monst *mtmp;
  int local_20;
  int style_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  short otyp_local;
  
  bVar2 = false;
  bVar10 = false;
  ty = 0;
  mtmp._4_4_ = style;
  local_20 = y2;
  style_local = x2;
  y2_local = y1;
  x2_local = x1;
  y1_local._2_2_ = otyp;
  otmp2 = sobj_at((int)otyp,level,x1,y1);
  if ((otmp2 == (obj *)0x0) && (y1_local._2_2_ == 0x214)) {
    bVar10 = true;
    otmp2 = sobj_at(0x214,level,style_local,local_20);
  }
  iVar6 = x2_local;
  iVar5 = y2_local;
  if (otmp2 == (obj *)0x0) {
    return 0;
  }
  if (bVar10) {
    x2_local = style_local;
    y2_local = local_20;
    style_local = iVar6;
    local_20 = iVar5;
  }
  if (otmp2->quan == 1) {
    _dist = (obj *)0x0;
    obj_extract_self(otmp2);
    ostack = otmp2;
    otmp2 = (obj *)0x0;
  }
  else {
    _dist = otmp2;
    ostack = splitobj(otmp2,1);
    obj_extract_self(ostack);
  }
  newsym(x2_local,y2_local);
  if ((((y1_local._2_2_ == 0x214) || (y1_local._2_2_ == 0x215)) && (ostack->ox == digging.pos.x)) &&
     (ostack->oy == digging.pos.y)) {
    memset(&digging,0,0x10);
  }
  delaycnt = distmin(x2_local,y2_local,style_local,local_20);
  bhitpos.x = (xchar)x2_local;
  bhitpos.y = (xchar)y2_local;
  singleobj._4_4_ = sgn(style_local - x2_local);
  singleobj._0_4_ = sgn(local_20 - y2_local);
  if (mtmp._4_4_ != 1) {
    if (mtmp._4_4_ == 0x41) {
      if (y1_local._2_2_ == 0x214) {
        bVar10 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar10 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar10 = false, u.umonnum != u.umonster)) {
            bVar3 = dmgtype(youmonst.data,0x24);
            bVar10 = bVar3 != '\0';
          }
          bVar10 = (bool)(bVar10 ^ 1);
        }
        pcVar9 = "rumbling in the distance.";
        if (bVar10) {
          pcVar9 = "someone bowling.";
        }
        You_hear(pcVar9);
      }
      mtmp._4_4_ = mtmp._4_4_ & 0xffffffbf;
    }
    else {
      if (mtmp._4_4_ != 0x81) goto LAB_0030deba;
      *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff | 0x8000;
      mtmp._4_4_ = 1;
    }
  }
  ty = 2;
LAB_0030deba:
  if (ty == 0) {
    ty = 1;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    flush_screen();
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    local_94 = (int)ostack->otyp;
  }
  else {
    local_94 = display_rng(0x219);
    local_94 = local_94 + 1;
  }
  tmp_at(-4,local_94 + 1);
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
LAB_0030dfa8:
  do {
    iVar5 = delaycnt + -1;
    if (delaycnt < 1 || bVar2) goto LAB_0030eada;
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    tx = ty;
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
      while (0 < tx) {
        (*windowprocs.win_delay)();
        tx = tx + -1;
      }
    }
    bhitpos.x = bhitpos.x + (char)singleobj._4_4_;
    bhitpos.y = bhitpos.y + (char)(int)singleobj;
    ptStack_78 = t_at(level,(int)bhitpos.x,(int)bhitpos.y);
    if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
      local_a0 = (monst *)0x0;
    }
    else {
      local_a0 = level->monsters[bhitpos.x][bhitpos.y];
    }
    otmp = (obj *)local_a0;
    if (local_a0 == (monst *)0x0) {
      if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
        if (multi != 0) {
          nomul(0,(char *)0x0);
        }
        cVar1 = ostack->spe;
        iVar6 = dmgval((monst *)0x0,ostack,'\x01',&youmonst);
        iVar6 = thitu(cVar1 + 9,iVar6,ostack,(obj *)0x0,(monst *)0x0,(char *)0x0);
        if (iVar6 != 0) {
          stop_occupation();
        }
      }
    }
    else {
      if (((y1_local._2_2_ == 0x214) && ((local_a0->data->mflags2 & 0x8000000) != 0)) &&
         (iVar6 = rn2(3), iVar6 != 0)) {
        pcVar9 = Monnam((monst *)otmp);
        pline("%s snatches the boulder.",pcVar9);
        *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff;
        mpickobj((monst *)otmp,ostack);
        bVar2 = true;
        goto LAB_0030eada;
      }
      local_bc = iVar5;
      if (mtmp._4_4_ == 1) {
        local_bc = -1;
      }
      iVar6 = ohitmon((monst *)0x0,(monst *)otmp,ostack,_dist,local_bc,'\0');
      if (iVar6 != 0) {
        bVar2 = true;
        goto LAB_0030eada;
      }
    }
    delaycnt = iVar5;
    if (mtmp._4_4_ == 1) {
      sVar4 = down_gate(bhitpos.x,bhitpos.y);
      if ((sVar4 != -1) && (bVar3 = ship_object(ostack,bhitpos.x,bhitpos.y,'\0'), bVar3 != '\0')) {
        bVar2 = true;
        goto LAB_0030eada;
      }
      if ((ptStack_78 != (trap *)0x0) && (y1_local._2_2_ == 0x214)) {
        uVar7 = (byte)ptStack_78->field_0x8 & 0x1f;
        if (uVar7 == 6) {
          iVar5 = rn2(10);
          if (2 < iVar5) {
            pcVar9 = "";
            if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
              pcVar9 = " The rolling boulder triggers a land mine.";
            }
            pline("KAABLAMM!!!%s",pcVar9);
            deltrap(level,ptStack_78);
            del_engr_at(level,(int)bhitpos.x,(int)bhitpos.y);
            place_object(ostack,level,(int)bhitpos.x,(int)bhitpos.y);
            *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff;
            fracture_rock(ostack);
            scatter((int)bhitpos.x,(int)bhitpos.y,4,0x1f,(obj *)0x0);
            if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
              newsym((int)bhitpos.x,(int)bhitpos.y);
            }
            bVar2 = true;
          }
        }
        else if (uVar7 - 0xb < 4) {
          style_local = (int)bhitpos.x;
          local_20 = (int)bhitpos.y;
          bVar3 = flooreffects(ostack,style_local,local_20,"fall");
          if (bVar3 != '\0') {
            bVar2 = true;
          }
          delaycnt = -1;
        }
        else if (uVar7 - 0x10 < 2) {
          if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
            You_hear("a rumbling stop abruptly.");
          }
          else {
            pline("Suddenly the rolling boulder disappears!");
          }
          *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff;
          if ((ptStack_78->field_0x8 & 0x1f) == 0x10) {
            rloco(ostack);
          }
          else {
            iVar5 = random_teleport_level();
            bmsg._4_4_ = iVar5;
            sVar4 = depth(&u.uz);
            if ((iVar5 == sVar4) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum))
            goto LAB_0030dfa8;
            get_level((d_level *)((long)&bmsg + 2),bmsg._4_4_);
            deliver_object(ostack,bmsg._2_1_,bmsg._3_1_,0);
          }
          seetrap(ptStack_78);
          bVar2 = true;
        }
        if ((bVar2) || (delaycnt == -1)) goto LAB_0030eada;
      }
      bVar3 = flooreffects(ostack,(int)bhitpos.x,(int)bhitpos.y,"fall");
      if (bVar3 != '\0') {
        bVar2 = true;
        goto LAB_0030eada;
      }
      if ((y1_local._2_2_ == 0x214) &&
         (_dy = sobj_at(0x214,level,(int)bhitpos.x,(int)bhitpos.y), _dy != (obj *)0x0)) {
        local_88 = " as one boulder sets another in motion";
        if ((bhitpos.x + singleobj._4_4_ < 1) ||
           ((((0x4f < bhitpos.x + singleobj._4_4_ || (bhitpos.y + (int)singleobj < 0)) ||
             (0x14 < bhitpos.y + (int)singleobj)) ||
            ((delaycnt == 0 ||
             (level->locations[bhitpos.x + singleobj._4_4_][bhitpos.y + (int)singleobj].typ < '\x11'
             )))))) {
          local_88 = " as one boulder hits another";
        }
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
          local_d0 = "";
        }
        else {
          local_d0 = local_88;
        }
        You_hear("a loud crash%s!",local_d0);
        obj_extract_self(_dy);
        *(uint *)&_dy->field_0x4a =
             *(uint *)&_dy->field_0x4a & 0xffff7fff |
             (*(uint *)&ostack->field_0x4a >> 0xf & 1) << 0xf;
        *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff;
        place_object(ostack,level,(int)bhitpos.x,(int)bhitpos.y);
        ostack = _dy;
        _dy = (obj *)0x0;
        wake_nearto((int)bhitpos.x,(int)bhitpos.y,100);
      }
    }
    if ((y1_local._2_2_ == 0x214) &&
       (bVar3 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar3 != '\0')) {
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
        pline("The boulder crashes through a door.");
      }
      *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 =
           *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0xfffffe0f | 0x10;
      if (delaycnt != 0) {
        unblock_point((int)bhitpos.x,(int)bhitpos.y);
      }
    }
    iVar6 = singleobj._4_4_;
    iVar5 = (int)singleobj;
    if ((((0 < delaycnt) && (0 < bhitpos.x + singleobj._4_4_)) &&
        (bhitpos.x + singleobj._4_4_ < 0x50)) &&
       (((-1 < bhitpos.y + (int)singleobj && (bhitpos.y + (int)singleobj < 0x15)) &&
        (level->locations[bhitpos.x + singleobj._4_4_][bhitpos.y + (int)singleobj].typ == '\x16'))))
    {
      x = (int)bhitpos.x;
      y = (int)bhitpos.y;
      local_20 = y;
      style_local = x;
      iVar8 = rn2(0x14);
      bVar3 = hits_bars(&ostack,x,y,iVar6,iVar5,(uint)((iVar8 != 0 ^ 0xffU) & 1),0);
      if (bVar3 != '\0') {
        if (ostack == (obj *)0x0) {
          bVar2 = true;
        }
LAB_0030eada:
        tmp_at(-6,0);
        if (bVar2) {
          x1_local = 2;
        }
        else {
          *(uint *)&ostack->field_0x4a = *(uint *)&ostack->field_0x4a & 0xffff7fff;
          place_object(ostack,level,style_local,local_20);
          newsym(style_local,local_20);
          x1_local = 1;
        }
        return x1_local;
      }
    }
  } while( true );
}

Assistant:

int launch_obj(short otyp, int x1, int y1, int x2, int y2, int style)
{
	struct monst *mtmp;
	struct obj *otmp, *otmp2;
	int dx, dy;
	struct obj *singleobj, *ostack;
	boolean used_up = FALSE;
	boolean otherside = FALSE;
	int dist;
	int tmp;
	int delaycnt = 0;

	otmp = sobj_at(otyp, level, x1, y1);
	/* Try the other side too, for rolling boulder traps */
	if (!otmp && otyp == BOULDER) {
		otherside = TRUE;
		otmp = sobj_at(otyp, level, x2, y2);
	}
	if (!otmp) return 0;
	if (otherside) {	/* swap 'em */
		int tx, ty;

		tx = x1; ty = y1;
		x1 = x2; y1 = y2;
		x2 = tx; y2 = ty;
	}

	if (otmp->quan == 1L) {
	    ostack = NULL;
	    obj_extract_self(otmp);
	    singleobj = otmp;
	    otmp = NULL;
	} else {
	    ostack = otmp;
	    singleobj = splitobj(otmp, 1L);
	    obj_extract_self(singleobj);
	}
	newsym(x1,y1);
	/* in case you're using a pick-axe to chop the boulder that's being
	   launched (perhaps a monster triggered it), destroy context so that
	   next dig attempt never thinks you're resuming previous effort */
	if ((otyp == BOULDER || otyp == STATUE) &&
	    singleobj->ox == digging.pos.x && singleobj->oy == digging.pos.y)
	    memset(&digging, 0, sizeof digging);

	dist = distmin(x1,y1,x2,y2);
	bhitpos.x = x1;
	bhitpos.y = y1;
	dx = sgn(x2 - x1);
	dy = sgn(y2 - y1);
	switch (style) {
	    case ROLL|LAUNCH_UNSEEN:
			if (otyp == BOULDER) {
			    You_hear(Hallucination ?
				     "someone bowling." :
				     "rumbling in the distance.");
			}
			style &= ~LAUNCH_UNSEEN;
			goto roll;
	    case ROLL|LAUNCH_KNOWN:
			/* use otrapped as a flag to ohitmon */
			singleobj->otrapped = 1;
			style &= ~LAUNCH_KNOWN;
			/* fall through */
	    roll:
	    case ROLL:
			delaycnt = 2;
			/* fall through */
	    default:
			if (!delaycnt)
			    delaycnt = 1;
			if (!cansee(bhitpos.x,bhitpos.y))
			    flush_screen();
			
			tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
			tmp_at(bhitpos.x, bhitpos.y);
	}

	/* Set the object in motion */
	while (dist-- > 0 && !used_up) {
		struct trap *t;
		tmp_at(bhitpos.x, bhitpos.y);
		tmp = delaycnt;

		/* dstage@u.washington.edu -- Delay only if hero sees it */
		if (cansee(bhitpos.x, bhitpos.y))
			while (tmp-- > 0) win_delay_output();

		bhitpos.x += dx;
		bhitpos.y += dy;
		t = t_at(level, bhitpos.x, bhitpos.y);
		
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
			if (otyp == BOULDER && throws_rocks(mtmp->data)) {
			    if (rn2(3)) {
				pline("%s snatches the boulder.",
					Monnam(mtmp));
				singleobj->otrapped = 0;
				mpickobj(mtmp, singleobj);
				used_up = TRUE;
				break;
			    }
			}
			if (ohitmon(NULL, mtmp, singleobj, ostack,
					(style==ROLL) ? -1 : dist, FALSE)) {
				used_up = TRUE;
				break;
			}
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
			if (multi) nomul(0, NULL);
			if (thitu(9 + singleobj->spe,
				  dmgval(NULL, singleobj, TRUE, &youmonst),
				  singleobj, NULL, NULL, NULL)) {
			    stop_occupation();
			}
		}
		if (style == ROLL) {
		    if (down_gate(bhitpos.x, bhitpos.y) != -1) {
		        if (ship_object(singleobj, bhitpos.x, bhitpos.y, FALSE)){
				used_up = TRUE;
				break;
			}
		    }
		    if (t && otyp == BOULDER) {
			switch(t->ttyp) {
			case LANDMINE:
			    if (rn2(10) > 2) {
			  	pline(
				  "KAABLAMM!!!%s",
				  cansee(bhitpos.x, bhitpos.y) ?
					" The rolling boulder triggers a land mine." : "");
				deltrap(level, t);
				del_engr_at(level, bhitpos.x,bhitpos.y);
				place_object(singleobj, level, bhitpos.x, bhitpos.y);
				singleobj->otrapped = 0;
				fracture_rock(singleobj);
				scatter(bhitpos.x,bhitpos.y, 4,
					MAY_DESTROY|MAY_HIT|MAY_FRACTURE|VIS_EFFECTS,
					NULL);
				if (cansee(bhitpos.x,bhitpos.y))
					newsym(bhitpos.x,bhitpos.y);
			        used_up = TRUE;
			    }
			    break;		
			case LEVEL_TELEP:
			case TELEP_TRAP:
			    if (cansee(bhitpos.x, bhitpos.y))
			    	pline("Suddenly the rolling boulder disappears!");
			    else
			    	You_hear("a rumbling stop abruptly.");
			    singleobj->otrapped = 0;
			    if (t->ttyp == TELEP_TRAP)
				rloco(singleobj);
			    else {
				int newlev = random_teleport_level();
				d_level dest;

				if (newlev == depth(&u.uz) || In_endgame(&u.uz))
				    continue;
				get_level(&dest, newlev);
				deliver_object(singleobj, dest.dnum, dest.dlevel,
					       MIGR_RANDOM);
			    }
			    seetrap(t);
			    used_up = TRUE;
			    break;
			case PIT:
			case SPIKED_PIT:
			case HOLE:
			case TRAPDOOR:
			    /* the boulder won't be used up if there is a
			       monster in the trap; stop rolling anyway */
			    x2 = bhitpos.x,  y2 = bhitpos.y;  /* stops here */
			    if (flooreffects(singleobj, x2, y2, "fall"))
				used_up = TRUE;
			    dist = -1;	/* stop rolling immediately */
			    break;
			}
			if (used_up || dist == -1) break;
		    }
		    if (flooreffects(singleobj, bhitpos.x, bhitpos.y, "fall")) {
			used_up = TRUE;
			break;
		    }
		    if (otyp == BOULDER &&
		       (otmp2 = sobj_at(BOULDER, level, bhitpos.x, bhitpos.y)) != 0) {
			const char *bmsg =
				     " as one boulder sets another in motion";

			if (!isok(bhitpos.x + dx, bhitpos.y + dy) || !dist ||
			    IS_ROCK(level->locations[bhitpos.x + dx][bhitpos.y + dy].typ))
			    bmsg = " as one boulder hits another";

			You_hear("a loud crash%s!",
				cansee(bhitpos.x, bhitpos.y) ? bmsg : "");
			obj_extract_self(otmp2);
			/* pass off the otrapped flag to the next boulder */
			otmp2->otrapped = singleobj->otrapped;
			singleobj->otrapped = 0;
			place_object(singleobj, level, bhitpos.x, bhitpos.y);
			singleobj = otmp2;
			otmp2 = NULL;
			wake_nearto(bhitpos.x, bhitpos.y, 10*10);
		    }
		}
		if (otyp == BOULDER && closed_door(level, bhitpos.x,bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y))
				pline("The boulder crashes through a door.");
			level->locations[bhitpos.x][bhitpos.y].doormask = D_BROKEN;
			if (dist) unblock_point(bhitpos.x, bhitpos.y);
		}

		/* if about to hit iron bars, do so now */
		if (dist > 0 && isok(bhitpos.x + dx,bhitpos.y + dy) &&
			level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS) {
		    x2 = bhitpos.x,  y2 = bhitpos.y;	/* object stops here */
		    if (hits_bars(&singleobj, x2, y2, dx, dy, !rn2(20), 0)) {
			if (!singleobj) used_up = TRUE;
			break;
		    }
		}
	}
	tmp_at(DISP_END, 0);
	if (!used_up) {
		singleobj->otrapped = 0;
		place_object(singleobj, level, x2,y2);
		newsym(x2,y2);
		return 1;
	} else
		return 2;
}